

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

shared_ptr<ast_refarraydimensions>
dcast<ast_refarraydimensions,ast_nodebase>(shared_ptr<ast_nodebase> *r)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  long *in_RSI;
  undefined1 auVar3 [16];
  shared_ptr<ast_refarraydimensions> sVar4;
  
  if (*in_RSI == 0) {
    peVar2 = (element_type *)0x0;
  }
  else {
    auVar3 = __dynamic_cast(*in_RSI,&ast_nodebase::typeinfo,&ast_refarraydimensions::typeinfo,0);
    in_RDX._M_pi = auVar3._8_8_;
    peVar2 = auVar3._0_8_;
  }
  if (peVar2 == (element_type *)0x0) {
    (r->super___shared_ptr<ast_nodebase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
    (r->super___shared_ptr<ast_nodebase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    (r->super___shared_ptr<ast_nodebase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar2;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
    (r->super___shared_ptr<ast_nodebase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var1;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
  }
  sVar4.super___shared_ptr<ast_refarraydimensions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar4.super___shared_ptr<ast_refarraydimensions,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)r;
  return (shared_ptr<ast_refarraydimensions>)
         sVar4.super___shared_ptr<ast_refarraydimensions,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> dcast( const std::shared_ptr<U>& r ) noexcept {
  if (auto p = dynamic_cast<typename std::shared_ptr<T>::element_type*>(r.get())) {
    return std::shared_ptr<T>(r, p);
  } else {
    return std::shared_ptr<T>();
  }
}